

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Bar.cxx
# Opt level: O1

void __thiscall Fl_Menu_Bar::draw(Fl_Menu_Bar *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Fl_Menu_Item *pFVar5;
  uint uVar6;
  int iVar7;
  
  Fl_Widget::draw_box((Fl_Widget *)this);
  pFVar5 = (this->super_Fl_Menu_).menu_;
  if ((pFVar5 != (Fl_Menu_Item *)0x0) && (pFVar5->text != (char *)0x0)) {
    iVar7 = (this->super_Fl_Menu_).super_Fl_Widget.x_;
    pFVar5 = Fl_Menu_Item::next(pFVar5,0);
    if (pFVar5->text != (char *)0x0) {
      iVar7 = iVar7 + 6;
      do {
        iVar2 = Fl_Menu_Item::measure(pFVar5,(int *)0x0,&this->super_Fl_Menu_);
        Fl_Menu_Item::draw(pFVar5,iVar7,(this->super_Fl_Menu_).super_Fl_Widget.y_,iVar2 + 0x10,
                           (this->super_Fl_Menu_).super_Fl_Widget.h_,&this->super_Fl_Menu_,0);
        iVar2 = iVar7 + iVar2;
        iVar7 = iVar2 + 0x10;
        if ((pFVar5->flags & 0x80) != 0) {
          iVar1 = (this->super_Fl_Menu_).super_Fl_Widget.y_;
          iVar3 = Fl::box_dy((uint)(this->super_Fl_Menu_).super_Fl_Widget.box_);
          uVar6 = iVar1 + iVar3;
          iVar1 = (this->super_Fl_Menu_).super_Fl_Widget.h_;
          uVar4 = Fl::box_dh((uint)(this->super_Fl_Menu_).super_Fl_Widget.box_);
          uVar4 = iVar1 + uVar6 + ~uVar4;
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,(ulong)(iVar2 + 10),(ulong)uVar6,(ulong)uVar4);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x36);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,(ulong)(iVar2 + 0xb),(ulong)uVar6,(ulong)uVar4);
        }
        pFVar5 = Fl_Menu_Item::next(pFVar5,1);
      } while (pFVar5->text != (char *)0x0);
    }
  }
  return;
}

Assistant:

void Fl_Menu_Bar::draw() {
  draw_box();
  if (!menu() || !menu()->text) return;
  const Fl_Menu_Item* m;
  int X = x()+6;
  for (m=menu()->first(); m->text; m = m->next()) {
    int W = m->measure(0,this) + 16;
    m->draw(X, y(), W, h(), this);
    X += W;
    if (m->flags & FL_MENU_DIVIDER) {
      int y1 = y() + Fl::box_dy(box());
      int y2 = y1 + h() - Fl::box_dh(box()) - 1;

      // Draw a vertical divider between menus...
      fl_color(FL_DARK3);
      fl_yxline(X - 6, y1, y2);
      fl_color(FL_LIGHT3);
      fl_yxline(X - 5, y1, y2);
    }
  }
}